

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::
     lexicographical_compare<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::less<int>>
               (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1,long last1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2,long last2)

{
  int iVar1;
  treeNode<int> *ptVar2;
  
  while( true ) {
    ptVar2 = first2->m_node;
    if (first1->m_node == *(treeNode<int> **)(last1 + 0x10)) {
      return ptVar2 != *(treeNode<int> **)(last2 + 0x10);
    }
    if (ptVar2 == *(treeNode<int> **)(last2 + 0x10)) {
      return false;
    }
    iVar1 = first1->m_node->value;
    if (ptVar2->value < iVar1) {
      return false;
    }
    if (iVar1 < ptVar2->value) break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first1);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first2);
  }
  return true;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}